

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O3

bool __thiscall H264StreamReader::skipNal(H264StreamReader *this,uint8_t *nal)

{
  int iVar1;
  _Hash_node_base *p_Var2;
  uint uVar3;
  uint8_t *end;
  const_iterator cVar4;
  bool bVar5;
  SEIUnit sei;
  key_type_conflict local_1cc;
  SEIUnit local_1c8;
  
  uVar3 = *nal & 0x1f;
  bVar5 = true;
  if (uVar3 != 0xc) {
    if (((*nal & 0x1e) == 10) &&
       (((this->super_MPEGStreamReader).m_eof != true ||
        (4 < (long)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd - (long)nal)))
       ) {
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::clear(&(this->updatedSPSList)._M_t);
    }
    else {
      if (this->m_needSeiCorrection == true) {
        if (uVar3 - 7 < 2) {
          return true;
        }
        if (uVar3 == 0xf) {
          return true;
        }
        if (uVar3 == 6) {
          local_1c8.m_processedMessages._M_h._M_buckets =
               &local_1c8.m_processedMessages._M_h._M_single_bucket;
          local_1c8.super_NALUnit.bitReader.super_BitStream.m_totalBits = 0;
          local_1c8.super_NALUnit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
          local_1c8.super_NALUnit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
          local_1c8.super_NALUnit.bitReader.m_curVal = 0;
          local_1c8.super_NALUnit.bitReader.m_bitLeft = 0;
          local_1c8.super_NALUnit.nal_unit_type = nuUnspecified;
          local_1c8.super_NALUnit.nal_ref_idc = 0;
          local_1c8.super_NALUnit.m_nalBuffer = (uint8_t *)0x0;
          local_1c8.super_NALUnit.m_nalBufferLen = 0;
          local_1c8.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__SEIUnit_0023d5a0;
          local_1c8.pic_struct = '\0';
          local_1c8.m_processedMessages._M_h._M_bucket_count = 1;
          local_1c8.m_processedMessages._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_1c8.m_processedMessages._M_h._M_element_count = 0;
          local_1c8.m_processedMessages._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          memset(&local_1c8.m_processedMessages._M_h._M_rehash_policy._M_next_resize,0,0x118);
          local_1c8.number_of_offset_sequences = -1;
          local_1c8.metadataPtsOffset = 0;
          local_1c8.m_mvcHeaderLen = 0;
          local_1c8.m_mvcHeaderStart = (uint8_t *)0x0;
          end = NALUnit::findNALWithStartCode
                          (nal,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,
                           true);
          NALUnit::decodeBuffer(&local_1c8.super_NALUnit,nal,end);
          uVar3 = 1;
          if (this->orig_hrd_parameters_present_flag == false) {
            uVar3 = (uint)this->orig_vcl_parameters_present_flag;
          }
          SEIUnit::deserialize
                    (&local_1c8,
                     (SPSUnit *)
                     (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1].
                     _M_parent,uVar3);
          if (*local_1c8.m_processedMessages._M_h._M_buckets != (__node_base_ptr)0x0) {
            p_Var2 = (*local_1c8.m_processedMessages._M_h._M_buckets)->_M_nxt;
            iVar1 = *(int *)&p_Var2[1]._M_nxt;
            do {
              if (iVar1 == 0) goto LAB_00187b96;
              p_Var2 = p_Var2->_M_nxt;
            } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                    (iVar1 = *(int *)&p_Var2[1]._M_nxt,
                    (ulong)(long)iVar1 % local_1c8.m_processedMessages._M_h._M_bucket_count == 0));
          }
          local_1cc = 1;
          cVar4 = std::
                  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find(&local_1c8.m_processedMessages._M_h,&local_1cc);
          if (cVar4.super__Node_iterator_base<int,_false>._M_cur != (__node_type *)0x0) {
LAB_00187b96:
            SEIUnit::~SEIUnit(&local_1c8);
            return true;
          }
          SEIUnit::~SEIUnit(&local_1c8);
        }
      }
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool H264StreamReader::skipNal(uint8_t *nal)
{
    const auto nalType = static_cast<NALUnit::NALType>(*nal & 0x1f);

    if (nalType == NALUnit::NALType::nuFillerData)
        return true;

    if (nalType == NALUnit::NALType::nuEOSeq || nalType == NALUnit::NALType::nuEOStream)
    {
        if (!m_eof || m_bufEnd - nal > 4)
        {
            updatedSPSList.clear();
            return true;
        }
    }

    if (!m_needSeiCorrection)
        return false;

    if (nalType == NALUnit::NALType::nuPPS || nalType == NALUnit::NALType::nuSPS ||
        nalType == NALUnit::NALType::nuSubSPS)
    {
        return true;  // SPS/PPS will be composed from our side on writePesHeader. It is required to compose SPS/PPS
                      // before SEI
    }
    if (nalType == NALUnit::NALType::nuSEI)
    {
        SEIUnit sei;
        const uint8_t *nextNal = NALUnit::findNALWithStartCode(nal, m_bufEnd, true);
        sei.decodeBuffer(nal, nextNal);
        sei.deserialize(*(m_spsMap.begin()->second),
                        orig_hrd_parameters_present_flag || orig_vcl_parameters_present_flag);

        if (sei.hasProcessedMessage(SEI_MSG_BUFFERING_PERIOD) || sei.hasProcessedMessage(SEI_MSG_PIC_TIMING))
        {
            return true;
        }
    }
    return false;
}